

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O3

int IDASetConstraints(void *ida_mem,N_Vector constraints)

{
  N_Vector_Ops p_Var1;
  undefined8 uVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  double dVar4;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar3 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x237;
  }
  else {
    if (constraints == (N_Vector)0x0) {
      if (*(int *)((long)ida_mem + 0x3c8) != 0) {
        N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1b8));
        *(long *)((long)ida_mem + 0x3a8) =
             *(long *)((long)ida_mem + 0x3a8) - *(long *)((long)ida_mem + 0x398);
        *(long *)((long)ida_mem + 0x3b0) =
             *(long *)((long)ida_mem + 0x3b0) - *(long *)((long)ida_mem + 0x3a0);
      }
      *(undefined4 *)((long)ida_mem + 0x3c8) = 0;
      *(undefined4 *)((long)ida_mem + 0x58) = 0;
      return 0;
    }
    p_Var1 = constraints->ops;
    if ((((p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
        (p_Var1->nvcompare == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0)) ||
       ((p_Var1->nvconstrmask == (_func_int_N_Vector_N_Vector_N_Vector *)0x0 ||
        (p_Var1->nvminquotient == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
      msgfmt = "A required vector operation is not implemented.";
      iVar3 = -0x16;
      error_code = -0x16;
      line = 0x251;
    }
    else {
      dVar4 = (double)N_VMaxNorm(constraints);
      if ((dVar4 <= 2.5) && (0.5 <= dVar4)) {
        if (*(int *)((long)ida_mem + 0x3c8) == 0) {
          uVar2 = N_VClone(constraints);
          *(undefined8 *)((long)ida_mem + 0x1b8) = uVar2;
          *(long *)((long)ida_mem + 0x3a8) =
               *(long *)((long)ida_mem + 0x3a8) + *(long *)((long)ida_mem + 0x398);
          *(long *)((long)ida_mem + 0x3b0) =
               *(long *)((long)ida_mem + 0x3b0) + *(long *)((long)ida_mem + 0x3a0);
          *(undefined4 *)((long)ida_mem + 0x3c8) = 1;
        }
        else {
          uVar2 = *(undefined8 *)((long)ida_mem + 0x1b8);
        }
        N_VScale(0x3ff0000000000000,constraints,uVar2);
        *(undefined4 *)((long)ida_mem + 0x58) = 1;
        return 0;
      }
      msgfmt = "Illegal values in constraints vector.";
      iVar3 = -0x16;
      error_code = -0x16;
      line = 0x25b;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetConstraints",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDASetConstraints(void* ida_mem, N_Vector constraints)
{
  IDAMem IDA_mem;
  sunrealtype temptest;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (constraints == NULL)
  {
    if (IDA_mem->ida_constraintsMallocDone)
    {
      N_VDestroy(IDA_mem->ida_constraints);
      IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
      IDA_mem->ida_liw -= IDA_mem->ida_liw1;
    }
    IDA_mem->ida_constraintsMallocDone = SUNFALSE;
    IDA_mem->ida_constraintsSet        = SUNFALSE;
    return (IDA_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv == NULL || constraints->ops->nvmaxnorm == NULL ||
      constraints->ops->nvcompare == NULL ||
      constraints->ops->nvconstrmask == NULL ||
      constraints->ops->nvminquotient == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    return (IDA_ILL_INPUT);
  }

  /*  Check the constraints vector */

  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_CONSTR);
    return (IDA_ILL_INPUT);
  }

  if (!(IDA_mem->ida_constraintsMallocDone))
  {
    IDA_mem->ida_constraints = N_VClone(constraints);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */

  N_VScale(ONE, constraints, IDA_mem->ida_constraints);

  IDA_mem->ida_constraintsSet = SUNTRUE;

  return (IDA_SUCCESS);
}